

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  CurrentAndTwoMoreIter args_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  static_string_view current;
  static_string_view key;
  CurrentAndTwoMoreIter args;
  CurrentAndTwoMoreIter local_60;
  CurrentAndTwoMoreIter local_48;
  
  cmArgumentList::CurrentAndTwoMoreIter::CurrentAndTwoMoreIter
            (&local_60,
             &newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  while (local_60.nextnext._M_node != (_List_node_base *)newArgs) {
    current.super_string_view._M_str = DAT_00a3e318;
    current.super_string_view._M_len = (anonymous_namespace)::keyAND;
    key.super_string_view._M_str = DAT_00a3e448;
    key.super_string_view._M_len = (anonymous_namespace)::keyOR;
    iVar3 = matchKeysImpl<1,cm::static_string_view,cm::static_string_view>
                      (this,(cmExpandedCommandArgument *)(local_60.next._M_node + 1),current,key);
    if (iVar3 != 0) {
      bVar1 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(local_60.current._M_node + 1),
                         errorString,status,false);
      bVar2 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(local_60.nextnext._M_node + 1),
                         errorString,status,false);
      if (iVar3 == 1) {
        bVar1 = bVar1 && bVar2;
      }
      else {
        bVar1 = (bVar1 || bVar2) && iVar3 == 2;
      }
      args_00.next._M_node = local_60.next._M_node;
      args_00.current._M_node = local_60.current._M_node;
      args_00.nextnext._M_node = local_60.nextnext._M_node;
      cmArgumentList::ReduceTwoArgs(newArgs,bVar1,args_00);
    }
    cmArgumentList::CurrentAndTwoMoreIter::advance
              (&local_48,&local_60,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.nextnext != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    if ((matchNo = this->matchKeys(*args.next, keyAND, keyOR))) {
      const auto lhs = this->GetBooleanValueWithAutoDereference(
        *args.current, errorString, status);
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.nextnext, errorString, status);
      // clang-format off
      const auto result =
        cmRt2CtSelector<
            std::logical_and, std::logical_or
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }
  }
  return true;
}